

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void google::protobuf::internal::MapFieldBase::SwapPayload(MapFieldBase *lhs,MapFieldBase *rhs)

{
  State SVar1;
  TaggedPtr TVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Arena *pAVar8;
  Arena *pAVar9;
  ReflectionPayload *this;
  ReflectionPayload *other;
  
  pAVar8 = arena(lhs);
  pAVar9 = arena(rhs);
  if (pAVar8 == pAVar9) {
    TVar2 = (rhs->super_MapFieldBaseForParse).payload_._M_i;
    (rhs->super_MapFieldBaseForParse).payload_._M_i =
         (lhs->super_MapFieldBaseForParse).payload_._M_i;
    (lhs->super_MapFieldBaseForParse).payload_._M_i = TVar2;
  }
  else {
    TVar2 = (lhs->super_MapFieldBaseForParse).payload_._M_i;
    if ((TVar2 & 1) == 0) {
      this = (ReflectionPayload *)0x0;
    }
    else {
      this = ToPayload(TVar2);
    }
    TVar2 = (rhs->super_MapFieldBaseForParse).payload_._M_i;
    if ((TVar2 & 1) == 0) {
      other = (ReflectionPayload *)0x0;
    }
    else {
      other = ToPayload(TVar2);
    }
    if (this != (ReflectionPayload *)0x0 || other != (ReflectionPayload *)0x0) {
      if (this == (ReflectionPayload *)0x0) {
        this = payload(lhs);
      }
      if (other == (ReflectionPayload *)0x0) {
        other = payload(rhs);
      }
      if (this != other) {
        if ((this->repeated_field).super_RepeatedPtrFieldBase.arena_ ==
            (other->repeated_field).super_RepeatedPtrFieldBase.arena_) {
          pvVar3 = (this->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_;
          iVar6 = (this->repeated_field).super_RepeatedPtrFieldBase.current_size_;
          iVar7 = (this->repeated_field).super_RepeatedPtrFieldBase.capacity_proxy_;
          iVar4 = (other->repeated_field).super_RepeatedPtrFieldBase.current_size_;
          iVar5 = (other->repeated_field).super_RepeatedPtrFieldBase.capacity_proxy_;
          (this->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
               (other->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_;
          (this->repeated_field).super_RepeatedPtrFieldBase.current_size_ = iVar4;
          (this->repeated_field).super_RepeatedPtrFieldBase.capacity_proxy_ = iVar5;
          (other->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = pvVar3;
          (other->repeated_field).super_RepeatedPtrFieldBase.current_size_ = iVar6;
          (other->repeated_field).super_RepeatedPtrFieldBase.capacity_proxy_ = iVar7;
        }
        else {
          RepeatedPtrFieldBase::
          SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                    ((RepeatedPtrFieldBase *)this,(RepeatedPtrFieldBase *)other);
        }
      }
      SVar1 = (other->state)._M_i;
      (other->state)._M_i = (this->state)._M_i;
      (this->state)._M_i = SVar1;
    }
  }
  return;
}

Assistant:

void MapFieldBase::SwapPayload(MapFieldBase& lhs, MapFieldBase& rhs) {
  if (lhs.arena() == rhs.arena()) {
    SwapRelaxed(lhs.payload_, rhs.payload_);
    return;
  }
  auto* p1 = lhs.maybe_payload();
  auto* p2 = rhs.maybe_payload();
  if (p1 == nullptr && p2 == nullptr) return;

  if (p1 == nullptr) p1 = &lhs.payload();
  if (p2 == nullptr) p2 = &rhs.payload();
  p1->repeated_field.Swap(&p2->repeated_field);
  SwapRelaxed(p1->state, p2->state);
}